

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall
cs::compiler_type::build_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *signals,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *objects)

{
  _Elt_pointer pptVar1;
  _Elt_pointer pptVar2;
  _Map_pointer ppptVar3;
  _Map_pointer ppptVar4;
  tree_type<cs::token_base_*> *ptVar5;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *pdVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  token_base *ptVar10;
  undefined4 extraout_var;
  iterator iVar11;
  token_base **pptVar12;
  reference pptVar13;
  compile_error *this_00;
  _Elt_pointer pptVar14;
  tree_type<cs::token_base_*> *ptVar15;
  tree_type<cs::token_base_*> *ptVar16;
  _Alloc_hider _Var17;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  _func_int **pp_Var18;
  size_t i;
  ulong __n;
  token_base **it;
  tree_type<cs::token_base_*> *__args;
  _func_int *p_Var19;
  tree_type<cs::token_base_*> t;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  tree_type<cs::token_base_*> local_e8;
  compiler_type *local_e0;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *local_d8;
  _Elt_pointer local_d0;
  string local_c8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  undefined8 *puStack_90;
  undefined8 *local_88;
  long lStack_80;
  _Map_pointer local_70;
  _Elt_pointer local_68;
  _Elt_pointer local_60;
  size_t local_58;
  _func_int **local_50;
  _func_int **local_48;
  tree_node *local_40;
  _func_int **local_38;
  
  pptVar14 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_68 != pptVar14) {
    pptVar1 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    pptVar2 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar2 != pptVar1) {
      ppptVar3 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      local_60 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      local_70 = (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      ppptVar4 = (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node;
      if (((long)local_60 - (long)pptVar14 >> 3) +
          ((long)local_68 -
           (long)(objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)ppptVar3 - (long)local_70) >> 3) - 1) +
          (ulong)(ppptVar3 == (_Map_pointer)0x0)) * 0x40 ==
          ((long)pptVar2 -
           (long)(signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)ppptVar4 -
                    (long)(signals->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(ppptVar4 == (_Map_pointer)0x0)) * 0x40 +
          ((long)(signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_start._M_last - (long)pptVar1 >> 3) + 1) {
        local_48 = (_func_int **)&PTR__token_expr_0032a6c0;
        local_40 = (tree_node *)&PTR__token_base_0032a5d0;
        local_e0 = this;
        local_d8 = objects;
        do {
          if ((*pptVar14 != (token_base *)0x0) &&
             (local_d0 = pptVar14, iVar8 = (*(*pptVar14)->_vptr_token_base[2])(),
             pptVar14 = local_d0, iVar8 == 9)) {
            ptVar10 = *local_d0;
            local_88 = (undefined8 *)0x0;
            lStack_80 = 0;
            local_98 = (undefined8 *)0x0;
            puStack_90 = (undefined8 *)0x0;
            local_a8 = 0;
            uStack_a0 = 0;
            local_c8.field_2._M_allocated_capacity = 0;
            local_c8.field_2._8_8_ = 0;
            local_c8._M_dataplus._M_p = (pointer)0x0;
            local_c8._M_string_length = 0;
            ptVar16 = (tree_type<cs::token_base_*> *)0x0;
            std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
                      ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_c8
                       ,0);
            pp_Var18 = ptVar10[2]._vptr_token_base;
            local_38 = ptVar10[4]._vptr_token_base;
            if (pp_Var18 != local_38) {
              local_50 = ptVar10[3]._vptr_token_base;
              local_58 = ptVar10[3].line_num;
              do {
                __args = (tree_type<cs::token_base_*> *)pp_Var18[2];
                ptVar5 = (tree_type<cs::token_base_*> *)pp_Var18[6];
                if (__args != ptVar5) {
                  ptVar15 = (tree_type<cs::token_base_*> *)pp_Var18[4];
                  p_Var19 = pp_Var18[5];
                  do {
                    if (local_98 == local_88 + -1) {
                      ptVar16 = __args;
                      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                      _M_push_back_aux<cs::token_base*const&>
                                ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_c8
                                 ,(token_base **)__args);
                    }
                    else {
                      *local_98 = __args->mRoot;
                      local_98 = local_98 + 1;
                    }
                    __args = __args + 1;
                    if (__args == ptVar15) {
                      __args = *(tree_type<cs::token_base_*> **)(p_Var19 + 8);
                      p_Var19 = p_Var19 + 8;
                      ptVar15 = __args + 0x40;
                    }
                  } while (__args != ptVar5);
                }
                local_e8.mRoot =
                     (tree_node *)token_base::operator_new((token_base *)0x18,(size_t)ptVar16);
                (local_e8.mRoot)->left = (tree_node *)0x1;
                (local_e8.mRoot)->root = local_40;
                *(undefined4 *)&(local_e8.mRoot)->right = 0xd;
                if (local_98 == local_88 + -1) {
                  ptVar16 = &local_e8;
                  std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                  _M_push_back_aux<cs::token_base*>
                            ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)&local_c8,
                             (token_base **)ptVar16);
                }
                else {
                  *local_98 = local_e8.mRoot;
                  local_98 = local_98 + 1;
                }
                pp_Var18 = pp_Var18 + 10;
                if (pp_Var18 == local_50) {
                  pp_Var18 = *(_func_int ***)(local_58 + 8);
                  local_58 = local_58 + 8;
                  local_50 = pp_Var18 + 0x3c;
                }
              } while (pp_Var18 != local_38);
            }
            if (local_98 == puStack_90) {
              operator_delete(puStack_90,0x200);
              puStack_90 = *(undefined8 **)(lStack_80 + -8);
              local_88 = puStack_90 + 0x40;
              local_98 = puStack_90 + 0x3f;
              lStack_80 = lStack_80 + -8;
            }
            else {
              local_98 = local_98 + -1;
            }
            objects = local_d8;
            this = local_e0;
            local_e8.mRoot = (tree_node *)0x0;
            ptVar16 = &local_e8;
            gen_tree(local_e0,ptVar16,
                     (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_c8);
            ptVar10 = (token_base *)token_base::operator_new((token_base *)0x18,(size_t)ptVar16);
            iVar8 = tree_type<cs::token_base_*>::copy
                              ((EVP_PKEY_CTX *)local_e8.mRoot,(EVP_PKEY_CTX *)0x0);
            ptVar10->line_num = 1;
            ptVar10->_vptr_token_base = local_48;
            ptVar10[1]._vptr_token_base = (_func_int **)CONCAT44(extraout_var,iVar8);
            *local_d0 = ptVar10;
            tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
            tree_type<cs::token_base_*>::destroy(local_e8.mRoot);
            std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base
                      ((_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_c8
                      );
            pptVar14 = local_d0;
          }
          pptVar14 = pptVar14 + 1;
          if (pptVar14 == local_60) {
            pptVar14 = local_70[1];
            local_70 = local_70 + 1;
            local_60 = pptVar14 + 0x40;
          }
        } while (pptVar14 != local_68);
        tree_type<cs::token_base_*>::destroy(tree->mRoot);
        tree->mRoot = (tree_node *)0x0;
        tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                  ((tree_type<cs::token_base*> *)tree,(iterator)0x0,
                   (signals->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_start._M_cur);
        tree_type<cs::token_base*>::emplace_left_left<cs::token_base*&>
                  ((tree_type<cs::token_base*> *)tree,tree->mRoot,
                   (objects->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                   ._M_impl.super__Deque_impl_data._M_start._M_cur);
        __n = 1;
        do {
          pdVar6 = local_d8;
          ppptVar3 = (signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_node;
          if (((long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_start._M_last -
               (long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_start._M_cur >> 3) +
              ((long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_cur -
               (long)(signals->
                     super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
                     .super__Deque_impl_data._M_finish._M_first >> 3) +
              ((((ulong)((long)ppptVar3 -
                        (long)(signals->
                              super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                              )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
              (ulong)(ppptVar3 == (_Map_pointer)0x0)) * 0x40 <= __n) {
            local_c8._M_dataplus._M_p = (pointer)tree->mRoot;
            if ((tree_node *)local_c8._M_dataplus._M_p != (tree_node *)0x0) {
              do {
                iVar11 = tree_type<cs::token_base_*>::iterator::right((iterator *)&local_c8);
                if (iVar11.mData == (tree_node *)0x0) {
                  pptVar14 = (pdVar6->
                             super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)
                             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                  if (pptVar14 ==
                      (pdVar6->
                      super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                      _M_impl.super__Deque_impl_data._M_finish._M_first) {
                    pptVar14 = (pdVar6->
                               super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>
                               )._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
                  }
                  tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                            ((tree_type<cs::token_base*> *)tree,(iterator)local_c8._M_dataplus._M_p,
                             pptVar14 + -1);
                  return;
                }
                local_c8._M_dataplus._M_p =
                     (pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&local_c8);
              } while ((tree_node *)local_c8._M_dataplus._M_p != (tree_node *)0x0);
            }
            return;
          }
          local_c8._M_dataplus._M_p = (pointer)tree->mRoot;
          if ((tree_node *)local_c8._M_dataplus._M_p != (tree_node *)0x0) {
            do {
              iVar11 = tree_type<cs::token_base_*>::iterator::right((iterator *)&local_c8);
              _Var17._M_p = local_c8._M_dataplus._M_p;
              if (iVar11.mData == (tree_node *)0x0) {
                pptVar13 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                     (local_d8,__n);
                tree_type<cs::token_base*>::emplace_right_right<cs::token_base*&>
                          ((tree_type<cs::token_base*> *)tree,(iterator)_Var17._M_p,pptVar13);
                break;
              }
              local_c8._M_dataplus._M_p =
                   (pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&local_c8);
            } while ((tree_node *)local_c8._M_dataplus._M_p != (tree_node *)0x0);
            local_c8._M_dataplus._M_p = (pointer)tree->mRoot;
            while ((tree_node *)local_c8._M_dataplus._M_p != (tree_node *)0x0) {
              iVar11 = tree_type<cs::token_base_*>::iterator::right((iterator *)&local_c8);
              _Var17._M_p = local_c8._M_dataplus._M_p;
              if (iVar11.mData == (tree_node *)0x0) {
                pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                     (signals,__n);
LAB_002a8043:
                tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                          ((tree_type<cs::token_base*> *)tree,(iterator)_Var17._M_p,pptVar12);
                break;
              }
              pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_c8);
              iVar8 = get_signal_level(this,*pptVar12);
              pptVar13 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                   (signals,__n);
              iVar9 = get_signal_level(this,*pptVar13);
              pptVar12 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_c8);
              if (iVar8 == iVar9) {
                bVar7 = is_left_associative(this,*pptVar12);
                _Var17._M_p = local_c8._M_dataplus._M_p;
                pptVar13 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                     (signals,__n);
                if (bVar7) {
                  tree_type<cs::token_base*>::emplace_right_left<cs::token_base*&>
                            ((tree_type<cs::token_base*> *)tree,(iterator)_Var17._M_p,pptVar13);
                  this = local_e0;
                }
                else {
                  tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
                            ((tree_type<cs::token_base*> *)tree,(iterator)_Var17._M_p,pptVar13);
                  this = local_e0;
                }
                break;
              }
              iVar8 = get_signal_level(this,*pptVar12);
              pptVar13 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                   (signals,__n);
              iVar9 = get_signal_level(this,*pptVar13);
              _Var17._M_p = local_c8._M_dataplus._M_p;
              if (iVar9 < iVar8) {
                pptVar12 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                                     (signals,__n);
                goto LAB_002a8043;
              }
              local_c8._M_dataplus._M_p =
                   (pointer)tree_type<cs::token_base_*>::iterator::right((iterator *)&local_c8);
            }
          }
          __n = __n + 1;
        } while( true );
      }
    }
  }
  this_00 = (compile_error *)__cxa_allocate_exception(0x28);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"Unexpected grammar when building expression tree.","");
  compile_error::compile_error(this_00,&local_c8);
  __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
}

Assistant:

void compiler_type::build_tree(tree_type<token_base *> &tree, std::deque<token_base *> &signals,
	                               std::deque<token_base *> &objects)
	{
		if (objects.empty() || signals.empty() || objects.size() != signals.size() + 1)
			throw compile_error("Unexpected grammar when building expression tree.");
		for (auto &obj: objects) {
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
		}
		tree.clear();
		tree.emplace_root_left(tree.root(), signals.front());
		tree.emplace_left_left(tree.root(), objects.front());
		for (std::size_t i = 1; i < signals.size(); ++i) {
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_right_right(it, objects.at(i));
					break;
				}
			}
			for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
				if (!it.right().usable()) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) == get_signal_level(signals.at(i))) {
					if (is_left_associative(it.data()))
						tree.emplace_right_left(it, signals.at(i));
					else
						tree.emplace_root_left(it, signals.at(i));
					break;
				}
				if (get_signal_level(it.data()) > get_signal_level(signals.at(i))) {
					tree.emplace_root_left(it, signals.at(i));
					break;
				}
			}
		}
		for (typename tree_type<token_base *>::iterator it = tree.root(); it.usable(); it = it.right()) {
			if (!it.right().usable()) {
				tree.emplace_right_right(it, objects.back());
				break;
			}
		}
	}